

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O3

int ProvideInput(Context *context)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = fread(context->input,1,0x80000,(FILE *)context->fin);
  context->available_in = sVar2;
  context->total_in = context->total_in + sVar2;
  context->next_in = context->input;
  iVar1 = ferror((FILE *)context->fin);
  if (iVar1 != 0) {
    ProvideInput_cold_1();
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static BROTLI_BOOL ProvideInput(Context* context) {
  context->available_in =
      fread(context->input, 1, kFileBufferSize, context->fin);
  context->total_in += context->available_in;
  context->next_in = context->input;
  if (ferror(context->fin)) {
    fprintf(stderr, "failed to read input [%s]: %s\n",
            PrintablePath(context->current_input_path), strerror(errno));
    return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}